

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 *puVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  pointer pTVar8;
  pointer pTVar9;
  Token *__cur;
  pointer pTVar10;
  EVP_PKEY_CTX *ctx;
  long lVar11;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x10;
  pTVar8 = (pointer)detail::allocArray(capacity,0x10);
  pIVar4 = args->info;
  *(undefined8 *)((long)pTVar8 + lVar11) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar8 + lVar11))[1] = pIVar4;
  pTVar9 = this->data_;
  pTVar10 = pTVar8;
  if (pTVar9 + this->len == pos) {
    for (; pTVar9 != pos; pTVar9 = pTVar9 + 1) {
      uVar5 = pTVar9->field_0x2;
      NVar6.raw = (pTVar9->numFlags).raw;
      uVar7 = pTVar9->rawLen;
      pIVar4 = pTVar9->info;
      pTVar10->kind = pTVar9->kind;
      pTVar10->field_0x2 = uVar5;
      pTVar10->numFlags = (NumericTokenFlags)NVar6.raw;
      pTVar10->rawLen = uVar7;
      pTVar10->info = pIVar4;
      pTVar10 = pTVar10 + 1;
    }
  }
  else {
    for (; pTVar9 != pos; pTVar9 = pTVar9 + 1) {
      uVar5 = pTVar9->field_0x2;
      NVar6.raw = (pTVar9->numFlags).raw;
      uVar7 = pTVar9->rawLen;
      pIVar4 = pTVar9->info;
      pTVar10->kind = pTVar9->kind;
      pTVar10->field_0x2 = uVar5;
      pTVar10->numFlags = (NumericTokenFlags)NVar6.raw;
      pTVar10->rawLen = uVar7;
      pTVar10->info = pIVar4;
      pTVar10 = pTVar10 + 1;
    }
    sVar2 = this->len;
    pTVar9 = this->data_;
    puVar3 = (undefined8 *)((long)pTVar8 + lVar11);
    for (; pos != pTVar9 + sVar2; pos = pos + 1) {
      pIVar4 = pos->info;
      puVar3[2] = *(undefined8 *)pos;
      puVar3[3] = pIVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pTVar8;
  return (pointer)((long)pTVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}